

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

void Cba_ManWriteConcat(Cba_Ntk_t *p,int iObj)

{
  char cVar1;
  uint uVar2;
  int iFon;
  uint uVar3;
  int iVar4;
  Cba_Man_t *pCVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vObjType).pArray[(uint)iObj] != 'Y') {
    __assert_fail("Cba_ObjIsConcat(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaWriteVer.c"
                  ,0x1ae,"void Cba_ManWriteConcat(Cba_Ntk_t *, int)");
  }
  pCVar5 = p->pDesign;
  uVar2 = (pCVar5->vOut).nSize;
  if (uVar2 == (pCVar5->vOut).nCap) {
    if ((int)uVar2 < 0x10) {
      pcVar7 = (pCVar5->vOut).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,0x10);
      }
      (pCVar5->vOut).pArray = pcVar7;
      (pCVar5->vOut).nCap = 0x10;
    }
    else {
      sVar6 = (ulong)uVar2 * 2;
      pcVar7 = (pCVar5->vOut).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar6);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,sVar6);
      }
      (pCVar5->vOut).pArray = pcVar7;
      (pCVar5->vOut).nCap = (int)sVar6;
    }
  }
  else {
    pcVar7 = (pCVar5->vOut).pArray;
  }
  iVar8 = (pCVar5->vOut).nSize;
  (pCVar5->vOut).nSize = iVar8 + 1;
  pcVar7[iVar8] = '{';
  uVar2 = (p->vObjFin0).nSize;
  if ((iObj < (int)uVar2) && (uVar10 = iObj + 1, uVar10 < uVar2)) {
    uVar2 = (p->vObjFin0).pArray[(uint)iObj];
    uVar9 = (ulong)uVar2;
    iVar8 = 0;
    do {
      if ((p->vObjFin0).pArray[uVar10] <= (int)uVar9) {
        uVar2 = (pCVar5->vOut).nSize;
        if (uVar2 == (pCVar5->vOut).nCap) {
          if ((int)uVar2 < 0x10) {
            pcVar7 = (pCVar5->vOut).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,0x10);
            }
            (pCVar5->vOut).pArray = pcVar7;
            (pCVar5->vOut).nCap = 0x10;
          }
          else {
            sVar6 = (ulong)uVar2 * 2;
            pcVar7 = (pCVar5->vOut).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar6);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,sVar6);
            }
            (pCVar5->vOut).pArray = pcVar7;
            (pCVar5->vOut).nCap = (int)sVar6;
          }
        }
        else {
          pcVar7 = (pCVar5->vOut).pArray;
        }
        iVar8 = (pCVar5->vOut).nSize;
        (pCVar5->vOut).nSize = iVar8 + 1;
        pcVar7[iVar8] = '}';
        return;
      }
      if ((int)uVar2 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p->vFinFon).nSize <= (int)uVar9) break;
      iFon = (p->vFinFon).pArray[uVar9];
      if (iVar8 != 0) {
        lVar11 = 0;
        do {
          cVar1 = "    \"%s\", "[lVar11 + 8];
          uVar3 = (pCVar5->vOut).nSize;
          if (uVar3 == (pCVar5->vOut).nCap) {
            if ((int)uVar3 < 0x10) {
              pcVar7 = (pCVar5->vOut).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              (pCVar5->vOut).pArray = pcVar7;
              (pCVar5->vOut).nCap = 0x10;
            }
            else {
              sVar6 = (ulong)uVar3 * 2;
              pcVar7 = (pCVar5->vOut).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar6);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,sVar6);
              }
              (pCVar5->vOut).pArray = pcVar7;
              (pCVar5->vOut).nCap = (int)sVar6;
            }
          }
          else {
            pcVar7 = (pCVar5->vOut).pArray;
          }
          iVar4 = (pCVar5->vOut).nSize;
          (pCVar5->vOut).nSize = iVar4 + 1;
          pcVar7[iVar4] = cVar1;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 2);
      }
      Cba_ManWriteFonName(p,iFon,1,0);
      uVar9 = uVar9 + 1;
      iVar8 = iVar8 + 1;
    } while ((int)uVar10 < (p->vObjFin0).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Cba_ManWriteConcat( Cba_Ntk_t * p, int iObj )
{
    int i, iFin, iFon;
    Vec_Str_t * vStr = &p->pDesign->vOut;
    assert( Cba_ObjIsConcat(p, iObj) );
    Vec_StrPush( vStr, '{' );
    Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
    {
        Vec_StrPrintStr( vStr, i ? ", " : "" );
        Cba_ManWriteFonName( p, iFon, 1, 0 );
    }
    Vec_StrPush( vStr, '}' );
}